

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

string * __thiscall
pfederc::BiOpExpr::toString_abi_cxx11_(string *__return_storage_ptr__,BiOpExpr *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  BiOpExpr *pBVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  size_type *psVar7;
  ulong *puVar8;
  undefined8 uVar9;
  ulong uVar10;
  BiOpExpr *biopexpr;
  Expr *pEVar11;
  string args;
  ulong *local_140;
  ulong local_138;
  ulong local_130;
  undefined8 uStack_128;
  string local_120;
  long *local_100;
  ulong local_f8;
  long local_f0;
  long lStack_e8;
  string *local_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  ulong *local_b8;
  ulong local_b0;
  ulong local_a8;
  long lStack_a0;
  BiOpExpr *local_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50 [2];
  ulong local_40 [2];
  
  if (this->opType - 0x2f < 3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_e0 = __return_storage_ptr__;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    (*((this->lhs)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_140);
    std::__cxx11::string::_M_append((char *)local_e0,(ulong)local_140);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    std::__cxx11::string::push_back((char)local_e0);
    local_138 = 0;
    local_130 = local_130 & 0xffffffffffffff00;
    pEVar11 = (this->rhs)._M_t.
              super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
              super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
              super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    local_140 = &local_130;
    local_98 = this;
    if (pEVar11->type == EXPR_BIOP) {
      do {
        if (pEVar11->_vptr_Expr != (_func_int **)&PTR__BiOpExpr_0012b990) {
          __cxa_bad_cast();
        }
        if (*(short *)&pEVar11[1].parent != 0x2e) break;
        (**(code **)(**(long **)&pEVar11[1].type + 0x10))(&local_d8);
        plVar4 = (long *)std::__cxx11::string::insert((ulong)&local_d8,0,'\x01');
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_f0 = *plVar6;
          lStack_e8 = plVar4[3];
          local_100 = &local_f0;
        }
        else {
          local_f0 = *plVar6;
          local_100 = (long *)*plVar4;
        }
        local_f8 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_140);
        psVar7 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_120.field_2._M_allocated_capacity = *psVar7;
          local_120.field_2._8_8_ = plVar4[3];
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        }
        else {
          local_120.field_2._M_allocated_capacity = *psVar7;
          local_120._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_120._M_string_length = plVar4[1];
        *plVar4 = (long)psVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_140,(string *)&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100,local_f0 + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        pEVar11 = (Expr *)pEVar11[1].lexer;
      } while (pEVar11->type == EXPR_BIOP);
    }
    (*pEVar11->_vptr_Expr[2])(&local_100,pEVar11);
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_140);
    pBVar3 = local_98;
    paVar1 = &local_120.field_2;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_120.field_2._M_allocated_capacity = *psVar7;
      local_120.field_2._8_8_ = plVar4[3];
      local_120._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar7;
      local_120._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_120._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_140,(string *)&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,local_f0 + 1);
    }
    std::__cxx11::string::_M_append((char *)local_e0,(ulong)local_140);
    if ((ushort)((short)*(undefined4 *)&pBVar3->opType - 0x2fU) < 3) {
      std::__cxx11::string::push_back((char)local_e0);
    }
    else {
      local_120._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,"Unexpected branch reached","");
      fatal("expr.cpp",0x34a,&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != paVar1) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_140 == &local_130) {
      return local_e0;
    }
    operator_delete(local_140,local_130 + 1);
    return local_e0;
  }
  if (this->opType != TOK_OP_NONE) {
    (*this->tokOp->_vptr_Token[2])(local_50,this->tokOp,(this->super_Expr).lexer);
    plVar4 = (long *)std::__cxx11::string::insert((ulong)local_50,0,'\x01');
    puVar8 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar8) {
      local_a8 = *puVar8;
      lStack_a0 = plVar4[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *puVar8;
      local_b8 = (ulong *)*plVar4;
    }
    local_b0 = plVar4[1];
    *plVar4 = (long)puVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_b8,local_b0,0,'\x01');
    puVar8 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar8) {
      local_c8 = *puVar8;
      uStack_c0 = (undefined4)plVar4[3];
      uStack_bc = *(undefined4 *)((long)plVar4 + 0x1c);
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *puVar8;
      local_d8 = (ulong *)*plVar4;
    }
    local_d0 = plVar4[1];
    *plVar4 = (long)puVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    (*((this->lhs)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_70);
    uVar10 = 0xf;
    if (local_d8 != &local_c8) {
      uVar10 = local_c8;
    }
    if (uVar10 < (ulong)(local_68 + local_d0)) {
      uVar10 = 0xf;
      if (local_70 != local_60) {
        uVar10 = local_60[0];
      }
      if (uVar10 < (ulong)(local_68 + local_d0)) goto LAB_0011c94a;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_d8);
    }
    else {
LAB_0011c94a:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_70);
    }
    local_100 = &local_f0;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_f0 = *plVar4;
      lStack_e8 = puVar5[3];
    }
    else {
      local_f0 = *plVar4;
      local_100 = (long *)*puVar5;
    }
    local_f8 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_100,local_f8,0,'\x01');
    paVar1 = &local_120.field_2;
    puVar8 = (ulong *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_120.field_2._M_allocated_capacity = *puVar8;
      local_120.field_2._8_8_ = plVar4[3];
      local_120._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_120.field_2._M_allocated_capacity = *puVar8;
      local_120._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_120._M_string_length = plVar4[1];
    *plVar4 = (long)puVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    (*((this->rhs)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_90);
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      uVar9 = local_120.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_88 + local_120._M_string_length) {
      uVar10 = 0xf;
      if (local_90 != local_80) {
        uVar10 = local_80[0];
      }
      if (uVar10 < local_88 + local_120._M_string_length) goto LAB_0011cbb1;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_90,0,(char *)0x0,(ulong)local_120._M_dataplus._M_p);
    }
    else {
LAB_0011cbb1:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_90);
    }
    local_140 = &local_130;
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_130 = *puVar8;
      uStack_128 = puVar5[3];
    }
    else {
      local_130 = *puVar8;
      local_140 = (ulong *)*puVar5;
    }
    local_138 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)puVar8 = 0;
    plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_140,local_138,0,'\x01');
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar7) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,local_f0 + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_50[0] == local_40) {
      return __return_storage_ptr__;
    }
    goto LAB_0011cd46;
  }
  (*((this->lhs)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t
     .super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
     super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_d8);
  puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x12205d);
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_f0 = *plVar4;
    lStack_e8 = puVar5[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *plVar4;
    local_100 = (long *)*puVar5;
  }
  local_f8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_100,local_f8,0,'\x01');
  paVar1 = &local_120.field_2;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_120.field_2._M_allocated_capacity = *puVar8;
    local_120.field_2._8_8_ = plVar4[3];
    local_120._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_120.field_2._M_allocated_capacity = *puVar8;
    local_120._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_120._M_string_length = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  (*((this->rhs)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t
     .super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
     super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_b8);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    uVar9 = local_120.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_b0 + local_120._M_string_length) {
    uVar10 = 0xf;
    if (local_b8 != &local_a8) {
      uVar10 = local_a8;
    }
    if (uVar10 < local_b0 + local_120._M_string_length) goto LAB_0011c8b6;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_b8,0,(char *)0x0,(ulong)local_120._M_dataplus._M_p);
  }
  else {
LAB_0011c8b6:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_b8);
  }
  local_140 = &local_130;
  puVar8 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar8) {
    local_130 = *puVar8;
    uStack_128 = puVar5[3];
  }
  else {
    local_130 = *puVar8;
    local_140 = (ulong *)*puVar5;
  }
  local_138 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_140,local_138,0,'\x01');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar7) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  local_40[0] = local_c8;
  local_50[0] = local_d8;
  if (local_d8 == &local_c8) {
    return __return_storage_ptr__;
  }
LAB_0011cd46:
  operator_delete(local_50[0],local_40[0] + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string BiOpExpr::toString() const noexcept {
  switch (getOperatorType()) {
  case TokenType::TOK_OP_BRACKET_OPEN:
  case TokenType::TOK_OP_ARR_BRACKET_OPEN:
  case TokenType::TOK_OP_TEMPL_BRACKET_OPEN: {
    std::string result;
    switch (getOperatorType()) {
      case TokenType::TOK_OP_BRACKET_OPEN:
        result += '(';
        break;
      case TokenType::TOK_OP_ARR_BRACKET_OPEN:
        result += '[';
        break;
      case TokenType::TOK_OP_TEMPL_BRACKET_OPEN:
        result += '{';
        break;
      default:
        fatal("expr.cpp", __LINE__, "Unexpected branch reached");
        break;
    }
    result += getLeft().toString();
    result += ' ';
    std::string args;
    const Expr * expr = &getRight();
    while (isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
      const BiOpExpr * biopexpr = dynamic_cast<const BiOpExpr*>(expr);
      args = ' ' + biopexpr->getRight().toString() + args;
      expr = &biopexpr->getLeft();
    }

    args = expr->toString() + args;
    result += args;
    switch (getOperatorType()) {
      case TokenType::TOK_OP_BRACKET_OPEN:
        result += ')';
        break;
      case TokenType::TOK_OP_ARR_BRACKET_OPEN:
        result += ']';
        break;
      case TokenType::TOK_OP_TEMPL_BRACKET_OPEN:
        result += '}';
        break;
      default:
        fatal("expr.cpp", __LINE__, "Unexpected branch reached");
        break;
    }

    return result;
  }
  case TokenType::TOK_OP_NONE:
    return "( " + getLeft().toString() + ' ' + getRight().toString() + ')';
  default:
    return '(' + getOperatorToken().toString(getLexer()) + ' ' +
      getLeft().toString() + ' ' + getRight().toString() + ')';
  }
}